

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChContactContainerSMC::GetContactableTorque
          (ChVector<double> *__return_storage_ptr__,ChContactContainerSMC *this,
          ChContactable *contactable)

{
  iterator iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChContactable *local_10;
  
  local_10 = contactable;
  iVar1 = std::
          _Hashtable<chrono::ChContactable_*,_std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>,_std::__detail::_Select1st,_std::equal_to<chrono::ChContactable_*>,_std::hash<chrono::ChContactable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->contact_forces)._M_h,&local_10);
  if (iVar1.
      super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
      ._M_cur == (__node_type *)0x0) {
    dVar2 = 0.0;
    dVar3 = 0.0;
    dVar4 = 0.0;
  }
  else {
    dVar2 = *(double *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                    ._M_cur + 0x28);
    dVar3 = *(double *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                    ._M_cur + 0x30);
    dVar4 = *(double *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                    ._M_cur + 0x38);
  }
  __return_storage_ptr__->m_data[0] = dVar2;
  __return_storage_ptr__->m_data[1] = dVar3;
  __return_storage_ptr__->m_data[2] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChContactContainerSMC::GetContactableTorque(ChContactable* contactable) {
    std::unordered_map<ChContactable*, ForceTorque>::const_iterator Iterator = contact_forces.find(contactable);
    if (Iterator != contact_forces.end()) {
        return Iterator->second.torque;
    }
    return ChVector<>(0);
}